

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

string * __thiscall OB::Parg::print_help_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  pointer piVar1;
  pointer pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  pointer pbVar4;
  const_iterator __begin3;
  pointer piVar5;
  stringstream out;
  stringstream ss;
  string local_360 [32];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_340);
  if ((this->description_)._M_string_length != 0) {
    poVar3 = std::operator<<(local_330,(string *)&this->name_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_330,"  ");
    poVar3 = std::operator<<(poVar3,(string *)&this->description_);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(local_330,local_360);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_360);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  if ((this->usage_)._M_string_length != 0) {
    poVar3 = std::operator<<(local_330,"Usage: ");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,(string *)&this->usage_);
    std::operator<<(poVar3,"\n");
  }
  if ((this->modes_)._M_string_length != 0) {
    poVar3 = std::operator<<(local_330,"Flags: ");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,(string *)&this->modes_);
  }
  if ((this->options_)._M_string_length != 0) {
    poVar3 = std::operator<<(local_330,"\nOptions: ");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,(string *)&this->options_);
  }
  piVar5 = (this->info_).
           super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->info_).
           super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar1) {
    for (; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      poVar3 = std::operator<<(local_330,"\n");
      poVar3 = std::operator<<(poVar3,(string *)piVar5);
      poVar3 = std::operator<<(poVar3,":");
      std::operator<<(poVar3,"\n");
      pbVar2 = (piVar5->text).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (piVar5->text).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1
          ) {
        poVar3 = std::operator<<(local_330,"  ");
        poVar3 = std::operator<<(poVar3,(string *)pbVar4);
        std::operator<<(poVar3,"\n");
      }
    }
  }
  if ((this->author_)._M_string_length != 0) {
    poVar3 = std::operator<<(local_330,"\nAuthor: ");
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,"  ");
    poVar3 = std::operator<<(poVar3,(string *)&this->author_);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringbuf::str();
    std::operator<<(local_330,local_360);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

std::string print_help() const
  {
    std::stringstream out;
    if (! description_.empty())
    {
      out << name_ << ":" << "\n";
      std::stringstream ss;
      out << "  " << description_ << "\n";
      out << ss.str() << "\n";
    }

    if (! usage_.empty())
    {
      out << "Usage: " << "\n"
        << usage_ << "\n";
    }

    if (! modes_.empty())
    {
      out << "Flags: " << "\n"
        << modes_;
    }

    if (! options_.empty())
    {
      out << "\nOptions: " << "\n"
        << options_;
    }

    if (! info_.empty())
    {
      for (auto const& e : info_)
      {
        out << "\n" << e.title << ":" << "\n";

        for (auto const& t : e.text)
        {
          out << "  " << t << "\n";
        }
      }
    }

    if (! author_.empty())
    {
      out << "\nAuthor: " << "\n";
      std::stringstream ss;
      ss << "  " << author_ << "\n";
      out << ss.str();
    }

    return out.str();
  }